

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeRTASBuilderBuildExtPrologue
          (ZEParameterValidation *this,ze_rtas_builder_ext_handle_t hBuilder,
          ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor,void *pScratchBuffer,
          size_t scratchBufferSizeBytes,void *pRtasBuffer,size_t rtasBufferSizeBytes,
          ze_rtas_parallel_operation_ext_handle_t hParallelOperation,void *pBuildUserPtr,
          ze_rtas_aabb_ext_t *pBounds,size_t *pRtasBufferSizeBytes)

{
  void *pRtasBuffer_local;
  size_t scratchBufferSizeBytes_local;
  void *pScratchBuffer_local;
  ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor_local;
  ze_rtas_builder_ext_handle_t hBuilder_local;
  ZEParameterValidation *this_local;
  
  if (hBuilder == (ze_rtas_builder_ext_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (pBuildOpDescriptor == (ze_rtas_builder_build_op_ext_desc_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pScratchBuffer == (void *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pRtasBuffer == (void *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if ((int)pBuildOpDescriptor->rtasFormat < 0x7fffffff) {
    if ((int)pBuildOpDescriptor->buildQuality < 3) {
      if (pBuildOpDescriptor->buildFlags < 4) {
        this_local._4_4_ =
             ParameterValidation::validateExtensions<_ze_rtas_builder_build_op_ext_desc_t_const*>
                       (pBuildOpDescriptor);
      }
      else {
        this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
      }
    }
    else {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeRTASBuilderBuildExtPrologue(
        ze_rtas_builder_ext_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_ext_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        void* pScratchBuffer,                           ///< [in][range(0, `scratchBufferSizeBytes`)] scratch buffer to be used
                                                        ///< during acceleration structure construction
        size_t scratchBufferSizeBytes,                  ///< [in] size of scratch buffer, in bytes
        void* pRtasBuffer,                              ///< [in] pointer to destination buffer
        size_t rtasBufferSizeBytes,                     ///< [in] destination buffer size, in bytes
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation, ///< [in][optional] handle to parallel operation object
        void* pBuildUserPtr,                            ///< [in][optional] pointer passed to callbacks
        ze_rtas_aabb_ext_t* pBounds,                    ///< [in,out][optional] pointer to destination address for acceleration
                                                        ///< structure bounds
        size_t* pRtasBufferSizeBytes                    ///< [out][optional] updated acceleration structure size requirement, in
                                                        ///< bytes
        )
    {
        if( nullptr == hBuilder )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pBuildOpDescriptor )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pScratchBuffer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pRtasBuffer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZE_RTAS_FORMAT_EXT_MAX < pBuildOpDescriptor->rtasFormat )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_RTAS_BUILDER_BUILD_QUALITY_HINT_EXT_HIGH < pBuildOpDescriptor->buildQuality )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0x3 < pBuildOpDescriptor->buildFlags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(pBuildOpDescriptor);
    }